

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall t_swift_generator::generate_enum(t_swift_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pptVar4;
  reference pptVar5;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_378;
  t_enum_value **local_370;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_2a8;
  t_enum_value **local_2a0;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_78;
  t_enum_value **local_70;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_68;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_38;
  t_enum *local_18;
  t_enum *tenum_local;
  t_swift_generator *this_local;
  
  local_18 = tenum;
  tenum_local = (t_enum *)this;
  if ((this->gen_cocoa_ & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_38);
    poVar3 = std::operator<<(poVar3,"public enum ");
    iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::operator<<(poVar3," : TEnum");
    std::__cxx11::string::~string((string *)&local_38);
    block_open(this,(ostream *)&this->f_decl_);
    __x = t_enum::get_constants(local_18);
    std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
              ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::__normal_iterator(&local_68);
    local_70 = (t_enum_value **)
               std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                         ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    local_68._M_current = local_70;
    while( true ) {
      local_78._M_current =
           (t_enum_value **)
           std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                     ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
      bVar1 = __gnu_cxx::operator!=(&local_68,&local_78);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_98);
      poVar3 = std::operator<<(poVar3,"case ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*(&local_68);
      enum_case_name_abi_cxx11_(&local_b8,this,*pptVar5,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_b8);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      __gnu_cxx::
      __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
      ::operator++(&local_68);
    }
    if ((this->safe_enums_ & 1U) != 0) {
      t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_d8);
      poVar3 = std::operator<<(poVar3,"case unknown(Int32)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_f8);
    poVar3 = std::operator<<(poVar3,"public static func read(from proto: TProtocol) throws -> ");
    iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::~string((string *)&local_f8);
    block_open(this,(ostream *)&this->f_decl_);
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_118);
    poVar3 = std::operator<<(poVar3,"let raw: Int32 = try proto.read()");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_118);
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_138);
    poVar3 = std::operator<<(poVar3,"let new = ");
    iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
    poVar3 = std::operator<<(poVar3,"(rawValue: raw)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_138);
    t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_158);
    poVar3 = std::operator<<(poVar3,"if let unwrapped = new {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_178);
    poVar3 = std::operator<<(poVar3,"return unwrapped");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_178);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_198);
    poVar3 = std::operator<<(poVar3,"} else {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_198);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_1b8);
    poVar3 = std::operator<<(poVar3,"throw TProtocolError(error: .invalidData,");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b8);
    t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_1d8);
    poVar3 = std::operator<<(poVar3,
                             "                     message: \"Invalid enum value (\\(raw)) for \\(")
    ;
    iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar2));
    poVar3 = std::operator<<(poVar3,".self)\")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d8);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_1f8);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    block_close(this,(ostream *)&this->f_decl_,true);
    std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_218);
    std::operator<<(poVar3,"public init()");
    std::__cxx11::string::~string((string *)&local_218);
    block_open(this,(ostream *)&this->f_decl_);
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_238);
    poVar3 = std::operator<<(poVar3,"self = .");
    pptVar4 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::front
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    enum_case_name_abi_cxx11_(&local_258,this,*pptVar4,false);
    poVar3 = std::operator<<(poVar3,(string *)&local_258);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    block_close(this,(ostream *)&this->f_decl_,true);
    std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_278);
    std::operator<<(poVar3,"public var rawValue: Int32");
    std::__cxx11::string::~string((string *)&local_278);
    block_open(this,(ostream *)&this->f_decl_);
    t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_298);
    poVar3 = std::operator<<(poVar3,"switch self {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_298);
    local_2a0 = (t_enum_value **)
                std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                          ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    local_68._M_current = local_2a0;
    while( true ) {
      local_2a8._M_current =
           (t_enum_value **)
           std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                     ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
      bVar1 = __gnu_cxx::operator!=(&local_68,&local_2a8);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_2c8);
      poVar3 = std::operator<<(poVar3,"case .");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*(&local_68);
      enum_case_name_abi_cxx11_(&local_2e8,this,*pptVar5,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
      poVar3 = std::operator<<(poVar3,": return ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*(&local_68);
      iVar2 = t_enum_value::get_value(*pptVar5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2c8);
      __gnu_cxx::
      __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
      ::operator++(&local_68);
    }
    if ((this->safe_enums_ & 1U) != 0) {
      t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_308);
      poVar3 = std::operator<<(poVar3,"case .unknown(let value): return value");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_308);
    }
    t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_328);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_328);
    block_close(this,(ostream *)&this->f_decl_,true);
    std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_348);
    std::operator<<(poVar3,"public init?(rawValue: Int32)");
    std::__cxx11::string::~string((string *)&local_348);
    block_open(this,(ostream *)&this->f_decl_);
    t_generator::indent_abi_cxx11_(&local_368,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_368);
    poVar3 = std::operator<<(poVar3,"switch rawValue {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_368);
    local_370 = (t_enum_value **)
                std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                          ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    local_68._M_current = local_370;
    while( true ) {
      local_378._M_current =
           (t_enum_value **)
           std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                     ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
      bVar1 = __gnu_cxx::operator!=(&local_68,&local_378);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_398);
      poVar3 = std::operator<<(poVar3,"case ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*(&local_68);
      iVar2 = t_enum_value::get_value(*pptVar5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3,": self = .");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*(&local_68);
      enum_case_name_abi_cxx11_(&local_3b8,this,*pptVar5,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_3b8);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      __gnu_cxx::
      __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
      ::operator++(&local_68);
    }
    if ((this->safe_enums_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_3d8,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_3d8);
      poVar3 = std::operator<<(poVar3,"default: return nil");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3d8);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_3f8,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_3f8);
      poVar3 = std::operator<<(poVar3,"default: self = .unknown(rawValue)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3f8);
    }
    t_generator::indent_abi_cxx11_(&local_418,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_418);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_418);
    block_close(this,(ostream *)&this->f_decl_,true);
    block_close(this,(ostream *)&this->f_decl_,true);
    std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
    std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
              ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  }
  else {
    generate_old_enum(this,tenum);
  }
  return;
}

Assistant:

void t_swift_generator::generate_enum(t_enum* tenum) {
  if (gen_cocoa_) {
    generate_old_enum(tenum);
    return;
  }
  f_decl_ << indent() << "public enum " << tenum->get_name() << " : TEnum";
  block_open(f_decl_);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;

  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << enum_case_name((*c_iter), true) << endl;
  }

  // unknown associated value case for safety and similar behavior to other languages
  if (safe_enums_) {
    f_decl_ << indent() << "case unknown(Int32)" << endl;
  }
  f_decl_ << endl;

  // TSerializable read(from:)
  f_decl_ << indent() << "public static func read(from proto: TProtocol) throws -> "
          << tenum->get_name();
  block_open(f_decl_);
  f_decl_ << indent() << "let raw: Int32 = try proto.read()" << endl;
  f_decl_ << indent() << "let new = " << tenum->get_name() << "(rawValue: raw)" << endl;

  f_decl_ << indent() << "if let unwrapped = new {" << endl;
  indent_up();
  f_decl_ << indent() << "return unwrapped" << endl;
  indent_down();
  f_decl_ << indent() << "} else {" << endl;
  indent_up();
  f_decl_ << indent() << "throw TProtocolError(error: .invalidData," << endl;
  f_decl_ << indent() << "                     message: \"Invalid enum value (\\(raw)) for \\("
          << tenum->get_name() << ".self)\")" << endl;
  indent_down();
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);

  // empty init for TSerializable
  f_decl_ << endl;
  f_decl_ << indent() << "public init()";
  block_open(f_decl_);

  f_decl_ << indent() << "self = ." << enum_case_name(constants.front(), false) << endl;
  block_close(f_decl_);
  f_decl_ << endl;

  // rawValue getter
  f_decl_ << indent() << "public var rawValue: Int32";
  block_open(f_decl_);
  f_decl_ << indent() << "switch self {" << endl;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case ." << enum_case_name((*c_iter), true)
            << ": return " << (*c_iter)->get_value() << endl;
  }
  if (safe_enums_) {
    f_decl_ << indent() << "case .unknown(let value): return value" << endl;
  }
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);
  f_decl_ << endl;

  // convenience rawValue initalizer
  f_decl_ << indent() << "public init?(rawValue: Int32)";
  block_open(f_decl_);
  f_decl_ << indent() << "switch rawValue {" << endl;;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << (*c_iter)->get_value()
            << ": self = ." << enum_case_name((*c_iter), true) << endl;
  }
  if (!safe_enums_) {
    f_decl_ << indent() << "default: return nil" << endl;
  } else {
    f_decl_ << indent() << "default: self = .unknown(rawValue)" << endl;
  }
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);




  block_close(f_decl_);
  f_decl_ << endl;
}